

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int prune_intra_y_mode(int64_t this_model_rd,int64_t *best_model_rd,int64_t *top_intra_model_rd,
                      int max_model_cnt_allowed,int model_rd_index_for_pruning)

{
  int j;
  int i;
  double thresh_top;
  double thresh_best;
  int model_rd_index_for_pruning_local;
  int max_model_cnt_allowed_local;
  int64_t *top_intra_model_rd_local;
  int64_t *best_model_rd_local;
  int64_t this_model_rd_local;
  int local_4;
  
  i = 0;
  while( true ) {
    if (max_model_cnt_allowed <= i) goto LAB_0033c465;
    if (this_model_rd < top_intra_model_rd[i]) break;
    i = i + 1;
  }
  for (j = max_model_cnt_allowed + -1; i < j; j = j + -1) {
    top_intra_model_rd[j] = top_intra_model_rd[j + -1];
  }
  top_intra_model_rd[i] = this_model_rd;
LAB_0033c465:
  if ((top_intra_model_rd[model_rd_index_for_pruning] == 0x7fffffffffffffff) ||
     ((double)this_model_rd <= (double)top_intra_model_rd[model_rd_index_for_pruning] * 1.0)) {
    if ((this_model_rd == 0x7fffffffffffffff) ||
       ((double)this_model_rd <= (double)*best_model_rd * 1.5)) {
      if (this_model_rd < *best_model_rd) {
        *best_model_rd = this_model_rd;
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int prune_intra_y_mode(int64_t this_model_rd, int64_t *best_model_rd,
                              int64_t top_intra_model_rd[],
                              int max_model_cnt_allowed,
                              int model_rd_index_for_pruning) {
  const double thresh_best = 1.50;
  const double thresh_top = 1.00;
  for (int i = 0; i < max_model_cnt_allowed; i++) {
    if (this_model_rd < top_intra_model_rd[i]) {
      for (int j = max_model_cnt_allowed - 1; j > i; j--) {
        top_intra_model_rd[j] = top_intra_model_rd[j - 1];
      }
      top_intra_model_rd[i] = this_model_rd;
      break;
    }
  }
  if (top_intra_model_rd[model_rd_index_for_pruning] != INT64_MAX &&
      this_model_rd >
          thresh_top * top_intra_model_rd[model_rd_index_for_pruning])
    return 1;

  if (this_model_rd != INT64_MAX &&
      this_model_rd > thresh_best * (*best_model_rd))
    return 1;
  if (this_model_rd < *best_model_rd) *best_model_rd = this_model_rd;
  return 0;
}